

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::Base64EncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  ulong uVar1;
  unsigned_long length;
  char *pcVar2;
  uchar *input;
  uchar *output;
  allocator local_289;
  ulong local_288;
  size_t rlen;
  undefined1 local_278 [8];
  vector<char,_std::allocator<char>_> encoded_buffer;
  allocator_type local_249;
  undefined1 local_248 [8];
  vector<char,_std::allocator<char>_> file_buffer;
  ifstream ifs;
  size_t len;
  string *file_local;
  cmCTest *this_local;
  
  length = cmsys::SystemTools::FileLength(file);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream
            (&file_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,pcVar2,
             _S_in);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_248,length + 1,&local_249);
  std::allocator<char>::~allocator(&local_249);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_248);
  std::istream::read(&file_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                     ,(long)pcVar2);
  std::ifstream::close();
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_278,(length * 3 >> 1) + 5,
             (allocator_type *)((long)&rlen + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&rlen + 7));
  input = (uchar *)std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)local_248);
  output = (uchar *)std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)local_278);
  local_288 = cmsysBase64_Encode(input,length,output,1);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_278);
  uVar1 = local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar1,&local_289);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_278);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_248);
  std::ifstream::~ifstream
            (&file_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64EncodeFile(std::string const& file)
{
  size_t const len = cmSystemTools::FileLength(file);
  cmsys::ifstream ifs(file.c_str(),
                      std::ios::in
#ifdef _WIN32
                        | std::ios::binary
#endif
  );
  std::vector<char> file_buffer(len + 1);
  ifs.read(file_buffer.data(), len);
  ifs.close();

  std::vector<char> encoded_buffer((len * 3) / 2 + 5);

  size_t const rlen = cmsysBase64_Encode(
    reinterpret_cast<unsigned char*>(file_buffer.data()), len,
    reinterpret_cast<unsigned char*>(encoded_buffer.data()), 1);

  return std::string(encoded_buffer.data(), rlen);
}